

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::TemplateContext::getScopeMap
          (map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
           *__return_storage_ptr__,TemplateContext *this)

{
  uint uVar1;
  mapped_type *__dest;
  TemplateContext *p;
  undefined1 local_58 [8];
  Reader params;
  TemplateContext *current;
  TemplateContext *this_local;
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  *result;
  
  std::
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  ::map(__return_storage_ptr__);
  params.reader._40_8_ = this;
  do {
    capnp::schema::Node::Reader::getParameters
              ((Reader *)local_58,(Reader *)(params.reader._40_8_ + 0x18));
    uVar1 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size((Reader *)local_58);
    if (uVar1 != 0) {
      p = (TemplateContext *)
          capnp::schema::Node::Reader::getId((Reader *)(params.reader._40_8_ + 0x18));
      __dest = std::
               map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&p);
      memcpy(__dest,local_58,0x30);
    }
    params.reader._40_8_ =
         kj::_::readMaybe<capnp::(anonymous_namespace)::CapnpcCppMain::TemplateContext_const>
                   ((Maybe<const_capnp::(anonymous_namespace)::CapnpcCppMain::TemplateContext_&> *)
                    params.reader._40_8_);
  } while ((TemplateContext *)params.reader._40_8_ != (TemplateContext *)0x0);
  return __return_storage_ptr__;
}

Assistant:

std::map<uint64_t, List<schema::Node::Parameter>::Reader> getScopeMap() const {
      std::map<uint64_t, List<schema::Node::Parameter>::Reader> result;
      const TemplateContext* current = this;
      for (;;) {
        auto params = current->node.getParameters();
        if (params.size() > 0) {
          result[current->node.getId()] = params;
        }
        KJ_IF_MAYBE(p, current->parent) {
          current = p;
        } else {
          return result;
        }
      }
    }